

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

Error __thiscall asmjit::Assembler::comment(Assembler *this,char *s,size_t len)

{
  long *plVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  Logger *logger;
  Error local_3c;
  
  if (*(int *)(in_RDI + 0x2c) == 0) {
    if ((*(uint *)(in_RDI + 0x38) & 4) == 0) {
      local_3c = 0;
    }
    else {
      plVar1 = *(long **)(*(long *)(in_RDI + 0x18) + 0x28);
      (**(code **)(*plVar1 + 0x10))(plVar1,in_RSI,in_RDX);
      (**(code **)(*plVar1 + 0x10))(plVar1,"\n",1);
      local_3c = 0;
    }
  }
  else {
    local_3c = *(Error *)(in_RDI + 0x2c);
  }
  return local_3c;
}

Assistant:

Error Assembler::comment(const char* s, size_t len) {
  if (_lastError) return _lastError;

#if !defined(ASMJIT_DISABLE_LOGGING)
  if (_globalOptions & kOptionLoggingEnabled) {
    Logger* logger = _code->getLogger();
    logger->log(s, len);
    logger->log("\n", 1);
    return kErrorOk;
  }
#else
  ASMJIT_UNUSED(s);
  ASMJIT_UNUSED(len);
#endif

  return kErrorOk;
}